

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_aux_del(bam1_t *b,uint8_t *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint8_t *puVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint8_t *__src;
  int l_aux;
  uint8_t *aux;
  uint8_t *p;
  uint8_t *s_local;
  bam1_t *b_local;
  
  iVar1 = b->l_data;
  uVar6 = *(undefined8 *)&(b->core).field_0x8;
  uVar7 = *(undefined8 *)&(b->core).field_0x8;
  iVar2 = (b->core).l_qseq;
  iVar3 = (b->core).l_qseq;
  puVar8 = b->data;
  uVar9 = *(undefined8 *)&(b->core).field_0x8;
  uVar10 = *(undefined8 *)&(b->core).field_0x8;
  iVar4 = (b->core).l_qseq;
  iVar5 = (b->core).l_qseq;
  __src = skip_aux(s);
  memmove(s + -2,__src,
          (long)(int)((((iVar1 + (uint)(ushort)((ulong)uVar6 >> 0x30) * -4) -
                       ((uint)((ulong)uVar7 >> 0x18) & 0xff)) - iVar2) - (iVar3 + 1 >> 1)) -
          ((long)__src -
          (long)(puVar8 + (long)iVar5 +
                          (long)(iVar4 + 1 >> 1) +
                          (long)(int)((uint)((ulong)uVar10 >> 0x18) & 0xff) +
                          (long)(int)((uint)(ushort)((ulong)uVar9 >> 0x30) << 2))));
  b->l_data = b->l_data - ((int)__src - (int)(s + -2));
  return 0;
}

Assistant:

int bam_aux_del(bam1_t *b, uint8_t *s)
{
    uint8_t *p, *aux;
    int l_aux = bam_get_l_aux(b);
    aux = bam_get_aux(b);
    p = s - 2;
    s = skip_aux(s);
    memmove(p, s, l_aux - (s - aux));
    b->l_data -= s - p;
    return 0;
}